

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

lyd_node * lyd_child_no_keys(lyd_node *node)

{
  lyd_node **pplVar1;
  lyd_node *plVar2;
  
  if (node == (lyd_node *)0x0) {
    return (lyd_node *)0x0;
  }
  if (node->schema == (lysc_node *)0x0) {
    return *(lyd_node **)(node + 1);
  }
  pplVar1 = lyd_node_child_p(node);
  if (pplVar1 != (lyd_node **)0x0) {
    for (plVar2 = *pplVar1; plVar2 != (lyd_node *)0x0; plVar2 = plVar2->next) {
      if (plVar2->schema == (lysc_node *)0x0) {
        return plVar2;
      }
      if ((plVar2->schema->flags & 0x100) == 0) {
        return plVar2;
      }
    }
  }
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_child_no_keys(const struct lyd_node *node)
{
    struct lyd_node **children;

    if (!node) {
        return NULL;
    }

    if (!node->schema) {
        /* opaq node */
        return ((struct lyd_node_opaq *)node)->child;
    }

    children = lyd_node_child_p((struct lyd_node *)node);
    if (children) {
        struct lyd_node *child = *children;

        while (child && child->schema && (child->schema->flags & LYS_KEY)) {
            child = child->next;
        }
        return child;
    } else {
        return NULL;
    }
}